

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O1

void CPU::WDC65816::ProcessorStorageConstructor::relative
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp local_d [5];
  
  local_d[0] = CycleFetchIncrementPC;
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,local_d);
    local_d[1] = 0x2e;
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,local_d + 1);
      local_d[2] = 3;
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,local_d + 2);
        local_d[3] = 3;
        if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
          (*target->_M_invoker)((_Any_data *)target,local_d + 3);
          local_d[4] = 0x30;
          if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
            (*target->_M_invoker)((_Any_data *)target,local_d + 4);
            return;
          }
        }
      }
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

static void relative(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);		// Offset.

		target(OperationPerform);			// The branch instructions will skip zero, one or three
											// of the next cycles, depending on the effect of
											// the jump. They'll also calculate the correct target
											// address, placing it into the data buffer.

		target(CycleFetchPreviousPCThrowaway);	// IO.
		target(CycleFetchPreviousPCThrowaway);	// IO.

		target(OperationCopyDataToPC);			// Install the address that was calculated above.
	}